

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O3

void __thiscall
HighsHessian::product
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *product)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  value_type_conflict1 local_20;
  
  if (0 < (long)this->dim_) {
    local_20 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(product,(long)this->dim_,&local_20)
    ;
    iVar1 = this->dim_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (product->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar10 + 1];
        if (iVar9 < iVar2) {
          lVar8 = (long)iVar9;
          do {
            iVar9 = piVar4[lVar8];
            pdVar7[iVar9] = pdVar5[lVar8] * pdVar6[lVar10] + pdVar7[iVar9];
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        lVar10 = lVar10 + 1;
        iVar9 = iVar2;
      } while (lVar10 != iVar1);
    }
  }
  return;
}

Assistant:

void HighsHessian::product(const std::vector<double>& solution,
                           std::vector<double>& product) const {
  if (this->dim_ <= 0) return;
  product.assign(this->dim_, 0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
         iEl++) {
      const HighsInt iRow = this->index_[iEl];
      product[iRow] += this->value_[iEl] * solution[iCol];
    }
  }
}